

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O2

bool __thiscall S2Cap::Decode(S2Cap *this,Decoder *decoder)

{
  VType VVar1;
  double length2;
  VType *pVVar2;
  VType VVar3;
  bool bVar4;
  size_t sVar5;
  ostream *poVar6;
  S1ChordAngle SVar7;
  S2LogMessage SStack_28;
  
  sVar5 = Decoder::avail(decoder);
  if (0x1f < sVar5) {
    pVVar2 = (VType *)decoder->buf_;
    VVar1 = pVVar2[2];
    decoder->buf_ = (uchar *)(pVVar2 + 3);
    VVar3 = pVVar2[1];
    (this->center_).c_[0] = *pVVar2;
    (this->center_).c_[1] = VVar3;
    (this->center_).c_[2] = VVar1;
    length2 = *(double *)decoder->buf_;
    decoder->buf_ = (uchar *)((long)decoder->buf_ + 8);
    SVar7 = S1ChordAngle::FromLength2(length2);
    (this->radius_).length2_ = SVar7.length2_;
    if (FLAGS_s2debug == true) {
      bVar4 = is_valid(this);
      if (!bVar4) {
        S2LogMessage::S2LogMessage
                  (&SStack_28,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.cc"
                   ,0x158,kFatal,(ostream *)&std::cerr);
        poVar6 = std::operator<<(SStack_28.stream_,"Check failed: is_valid() ");
        poVar6 = std::operator<<(poVar6,"Invalid S2Cap: ");
        ::operator<<(poVar6,this);
        abort();
      }
    }
  }
  return 0x1f < sVar5;
}

Assistant:

bool S2Cap::Decode(Decoder* decoder) {
  if (decoder->avail() < 4 * sizeof(double)) return false;

  double x = decoder->getdouble();
  double y = decoder->getdouble();
  double z = decoder->getdouble();
  center_ = S2Point(x, y, z);
  radius_ = S1ChordAngle::FromLength2(decoder->getdouble());

  if (FLAGS_s2debug) {
     S2_CHECK(is_valid()) << "Invalid S2Cap: " << *this;
  }
  return true;
}